

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

bool __thiscall wasm::WATParser::anon_unknown_10::LexCtx::canFinish(LexCtx *this)

{
  bool bVar1;
  size_t sVar2;
  undefined8 in_RCX;
  char *pcVar3;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> sv;
  string_view in;
  string_view in_00;
  bool local_99;
  anon_unknown_10 *local_88;
  char *local_80;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> local_78;
  string_view local_60;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> local_50;
  string_view local_38;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> local_28;
  LexCtx *local_10;
  LexCtx *this_local;
  
  local_10 = this;
  bVar1 = empty(this);
  pcVar3 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar1);
  local_99 = true;
  if (!bVar1) {
    local_38 = next(this);
    sVar4._M_str = pcVar3;
    sVar4._M_len = (size_t)local_38._M_str;
    lparen(&local_28,(anon_unknown_10 *)local_38._M_len,sVar4);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_28);
    pcVar3 = (char *)CONCAT71((int7)((ulong)pcVar3 >> 8),bVar1);
    local_99 = true;
    if (!bVar1) {
      local_60 = next(this);
      in._M_str = pcVar3;
      in._M_len = (size_t)local_60._M_str;
      rparen(&local_50,(anon_unknown_10 *)local_60._M_len,in);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_50);
      pcVar3 = (char *)CONCAT71((int7)((ulong)pcVar3 >> 8),bVar1);
      local_99 = true;
      if (!bVar1) {
        sVar4 = next(this);
        local_88 = (anon_unknown_10 *)sVar4._M_len;
        local_80 = sVar4._M_str;
        in_00._M_str = pcVar3;
        in_00._M_len = (size_t)local_80;
        spacechar(&local_78,local_88,in_00);
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_78);
        local_99 = true;
        if (!bVar1) {
          sv = ::sv(";;",2);
          sVar2 = startsWith(this,sv);
          local_99 = sVar2 != 0;
        }
      }
    }
  }
  return local_99;
}

Assistant:

bool LexCtx::canFinish() const {
  // Logically we want to check for eof, parens, and space. But we don't
  // actually want to parse more than a couple characters of space, so check for
  // individual space chars or comment starts instead.
  return empty() || lparen(next()) || rparen(next()) || spacechar(next()) ||
         startsWith(";;"sv);
}